

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_misc.h
# Opt level: O0

int mbedtls_ssl_sig_alg_is_offered(mbedtls_ssl_context *ssl,uint16_t proposed_sig_alg)

{
  uint16_t *local_28;
  uint16_t *sig_alg;
  uint16_t proposed_sig_alg_local;
  mbedtls_ssl_context *ssl_local;
  
  local_28 = (uint16_t *)mbedtls_ssl_get_sig_algs(ssl);
  if (local_28 != (uint16_t *)0x0) {
    for (; *local_28 != 0; local_28 = local_28 + 1) {
      if (*local_28 == proposed_sig_alg) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static inline int mbedtls_ssl_sig_alg_is_offered(const mbedtls_ssl_context *ssl,
                                                 uint16_t proposed_sig_alg)
{
    const uint16_t *sig_alg = mbedtls_ssl_get_sig_algs(ssl);
    if (sig_alg == NULL) {
        return 0;
    }

    for (; *sig_alg != MBEDTLS_TLS_SIG_NONE; sig_alg++) {
        if (*sig_alg == proposed_sig_alg) {
            return 1;
        }
    }
    return 0;
}